

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthStateMonitor.cpp
# Opt level: O0

void __thiscall PartVolumeButton::contextMenuEvent(PartVolumeButton *this,QContextMenuEvent *event)

{
  QObject *pQVar1;
  QPoint *pQVar2;
  socklen_t *in_RCX;
  sockaddr *in_RDX;
  QKeySequence local_138 [8];
  QString local_130;
  QKeySequence local_118 [8];
  QString local_110;
  QKeySequence local_f8 [8];
  QString local_f0;
  QKeySequence local_d8 [8];
  QString local_d0;
  QObject local_b8 [8];
  int local_b0 [2];
  QSlider volumeControlSlider;
  QWidgetAction local_80 [8];
  QWidgetAction volumeControlAction;
  QString local_60;
  QWidget *local_48;
  QMenu *volumeMenu;
  QMenu menu;
  QContextMenuEvent *event_local;
  PartVolumeButton *this_local;
  
  QEvent::accept((QEvent *)event,(int)event,in_RDX,in_RCX);
  QMenu::QMenu((QMenu *)&volumeMenu,(QWidget *)this);
  QString::QString(&local_60,"Volume");
  pQVar1 = (QObject *)QMenu::addMenu((QString *)&volumeMenu);
  QString::~QString(&local_60);
  local_48 = (QWidget *)pQVar1;
  QWidgetAction::QWidgetAction(local_80,pQVar1);
  QSlider::QSlider((QSlider *)&stack0xffffffffffffff58,local_48);
  QAbstractSlider::setRange((int)&stack0xffffffffffffff58,0);
  local_b0[1] = 0;
  local_b0[0] = 100;
  qBound<int>(local_b0 + 1,&this->volume,local_b0);
  QAbstractSlider::setValue((int)&stack0xffffffffffffff58);
  QObject::connect(local_b8,(int)this,(sockaddr *)&stack0xffffffffffffff58,0x1c95a3);
  QMetaObject::Connection::~Connection((Connection *)local_b8);
  QWidgetAction::setDefaultWidget((QWidget *)local_80);
  QWidget::addAction((QAction *)local_48);
  QString::QString(&local_d0,"Reset Volume");
  QKeySequence::QKeySequence(local_d8);
  QMenu::addAction((QString *)&volumeMenu,(QObject *)&local_d0,(char *)this,
                   (QKeySequence *)"1handleResetVolumeTriggered()");
  QKeySequence::~QKeySequence(local_d8);
  QString::~QString(&local_d0);
  QString::QString(&local_f0,"Solo");
  QKeySequence::QKeySequence(local_f8);
  QMenu::addAction((QString *)&volumeMenu,(QObject *)&local_f0,(char *)this,
                   (QKeySequence *)"1handleSoloTriggered()");
  QKeySequence::~QKeySequence(local_f8);
  QString::~QString(&local_f0);
  QString::QString(&local_110,"Unmute All");
  QKeySequence::QKeySequence(local_118);
  QMenu::addAction((QString *)&volumeMenu,(QObject *)&local_110,(char *)this,
                   (QKeySequence *)"1handleUnmuteAllTriggered()");
  QKeySequence::~QKeySequence(local_118);
  QString::~QString(&local_110);
  QString::QString(&local_130,"Reset All");
  QKeySequence::QKeySequence(local_138);
  QMenu::addAction((QString *)&volumeMenu,(QObject *)&local_130,(char *)this,
                   (QKeySequence *)"1handleResetAllTriggered()");
  QKeySequence::~QKeySequence(local_138);
  QString::~QString(&local_130);
  pQVar2 = QContextMenuEvent::globalPos(event);
  QMenu::exec((QPoint *)&volumeMenu,(QAction *)pQVar2);
  QSlider::~QSlider((QSlider *)&stack0xffffffffffffff58);
  QWidgetAction::~QWidgetAction(local_80);
  QMenu::~QMenu((QMenu *)&volumeMenu);
  return;
}

Assistant:

void PartVolumeButton::contextMenuEvent(QContextMenuEvent *event) {
	event->accept();
	QMenu menu(this);
	QMenu *volumeMenu = menu.addMenu("Volume");
	QWidgetAction volumeControlAction(volumeMenu);
	QSlider volumeControlSlider(volumeMenu);
	volumeControlSlider.setRange(0, 100);
	volumeControlSlider.setValue(qBound(0, volume, 100));
	connect(&volumeControlSlider, SIGNAL(valueChanged(int)), SLOT(handleVolumeChanged(int)));
	volumeControlAction.setDefaultWidget(&volumeControlSlider);
	volumeMenu->addAction(&volumeControlAction);
	menu.addAction("Reset Volume", this, SLOT(handleResetVolumeTriggered()));
	menu.addAction("Solo", this, SLOT(handleSoloTriggered()));
	menu.addAction("Unmute All", this, SLOT(handleUnmuteAllTriggered()));
	menu.addAction("Reset All", this, SLOT(handleResetAllTriggered()));
	menu.exec(event->globalPos());
}